

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Test::TestBody
          (TaprootUtil_CreateTapScriptControl_Elements_Test *this)

{
  ScriptBuilder *pSVar1;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *utxo_list_00;
  initializer_list<cfd::core::ByteData256> __l;
  bool is_parity;
  AssertHelper local_988;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_8;
  AssertHelper local_950;
  SchnorrSignature schnorr_sig;
  ConfidentialTransaction tx1;
  SigHashType sighash_type;
  ConfidentialTransaction tx2;
  SchnorrSignature sig2;
  SchnorrPubkey schnorr_pubkey;
  ByteData256 sighash2;
  Address addr2;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxo_list;
  Pubkey pk1;
  SchnorrPubkey pk0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ConfidentialAssetId asset;
  Amount amt2;
  Amount amt1;
  ConfidentialValue val2;
  ByteData der_sig;
  ByteData sig;
  ByteData256 sighash;
  ByteData taproot_control;
  Pubkey pubkey;
  SigHashType local_4a0;
  SigHashType local_494;
  Privkey key;
  TapScriptData script_data;
  Amount fee2;
  BlockHash genesis_block_hash;
  Privkey key1;
  Amount fee1;
  Amount amt0;
  Script locking_script;
  ConfidentialValue val1;
  ConfidentialValue val0;
  Address addr01;
  Script redeem_script;
  TaprootScriptTree tree;
  Script pkh_script1;
  ScriptWitness local_c8;
  ScriptWitness local_a8;
  ScriptWitness local_88;
  ScriptWitness local_68;
  ScriptWitness local_48;
  
  std::__cxx11::string::string
            ((string *)&addr01,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&addr2);
  cfd::core::Privkey::Privkey(&key,(string *)&addr01,kMainnet,true);
  std::__cxx11::string::~string((string *)&addr01);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&addr01,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr2,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x476a4d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr01);
  std::__cxx11::string::~string((string *)&addr01);
  if ((undefined1)addr2.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&addr01);
    if (addr2._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)addr2._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr01);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr2.witness_ver_);
  addr2.type_._0_1_ = is_parity;
  addr2.witness_ver_ = kVersion0;
  addr2._12_4_ = 0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&sig2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&addr01,(internal *)&addr2,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x8e,(char *)addr01._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    std::__cxx11::string::~string((string *)&addr01);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr2.witness_ver_);
  addr01._0_8_ = &PTR__ScriptBuilder_006f8aa0;
  addr01.witness_ver_ = kVersion0;
  addr01._12_4_ = 0;
  addr01.address_._M_dataplus._M_p = (pointer)0x0;
  addr01.address_._M_string_length = 0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&addr2,&schnorr_pubkey);
  pSVar1 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&addr01,(ByteData *)&addr2);
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&redeem_script,pSVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&addr01);
  std::__cxx11::string::string
            ((string *)&addr2,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&tree);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&addr01,(string *)&addr2);
  std::__cxx11::string::string
            ((string *)&sig2,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&tx1);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&addr01.address_._M_string_length,(string *)&sig2);
  __l._M_len = 2;
  __l._M_array = (iterator)&addr01;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&tx2);
  lVar2 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&addr01.type_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&sig2);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&redeem_script,kElementsRegtest);
  cfd::core::TaprootScriptTree::AddBranch
            (&tree,nodes.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)&addr01,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::core::TapBranch::AddBranch(&tree.super_TapBranch,(SchnorrPubkey *)&addr01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  cfd::core::Script::Script(&locking_script);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pk0);
  cfd::core::TaprootUtil::CreateTapScriptControl
            (&taproot_control,&schnorr_pubkey,&tree.super_TapBranch,&pk0,&locking_script);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&addr01,kCfdInvalidSettingError,kVersion1,&pk0,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr2);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr2);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&addr2,&addr01);
  testing::internal::CmpHelperEQ<char[64],std::__cxx11::string>
            ((internal *)&sig2,"\"ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r\""
             ,"addr01.GetAddress()",
             (char (*) [64])"ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&sig2,&locking_script);
  cfd::core::Address::GetLockingScript((Script *)&addr2,&addr01);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tx1,(Script *)&addr2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&tx2,"locking_script.GetHex()","addr01.GetLockingScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx1);
  std::__cxx11::string::~string((string *)&tx1);
  cfd::core::Script::~Script((Script *)&addr2);
  std::__cxx11::string::~string((string *)&sig2);
  if ((char)tx2.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (tx2.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *tx2.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tx2.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::Address::GetLockingScript((Script *)&addr2,&addr01);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&sig2,(Script *)&addr2);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tx1,
             "\"5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Script::~Script((Script *)&addr2);
  if ((char)tx1.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (tx1.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *tx1.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tx1.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx1,2,0);
  std::__cxx11::string::string
            ((string *)&addr2,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&sig2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::string
            ((string *)&sig2,"cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd",
             (allocator *)&tx2);
  cfd::core::Txid::Txid((Txid *)&addr2,(string *)&sig2);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&tx1,(Txid *)&addr2,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount(&amt0,2500000000);
  cfd::core::ConfidentialValue::ConfidentialValue(&val0,&amt0);
  cfd::core::Amount::Amount(&amt1,0x9502f518);
  cfd::core::ConfidentialValue::ConfidentialValue(&val1,&amt1);
  cfd::core::ConfidentialTransaction::AddTxOut(&tx1,&amt1,&asset,&locking_script);
  cfd::core::Amount::Amount(&fee1,1000);
  cfd::core::ConfidentialTransaction::AddTxOutFee(&tx1,&fee1,&asset);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&addr2,&tx1.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperEQ<char[349],std::__cxx11::string>
            ((internal *)&sig2,
             "\"020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000\""
             ,"tx1.GetHex()",
             (char (*) [349])
             "020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&addr2,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)&sig2);
  cfd::core::Privkey::FromWif(&key1,(string *)&addr2,kCustomChain,true);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::string
            ((string *)&addr2,"023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)&sig2);
  cfd::core::Pubkey::Pubkey(&pk1,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::ScriptUtil::CreateP2pkhLockingScript(&pkh_script1,&pk1);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  cfd::core::Script::GetData((ByteData *)&addr2,&pkh_script1);
  cfd::core::SigHashType::SigHashType(&local_494,&sighash_type);
  cfd::core::ConfidentialTransaction::GetElementsSignatureHash
            (&sighash,&tx1,0,(ByteData *)&addr2,&local_494,&val0,kVersion0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::Privkey::CalculateEcSignature(&sig,&key1,&sighash,true);
  cfd::core::CryptoUtil::ConvertSignatureToDer(&der_sig,&sig,&sighash_type);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack(&local_48,&tx1,0,&der_sig);
  cfd::core::ScriptWitness::~ScriptWitness(&local_48);
  cfd::core::Pubkey::GetData((ByteData *)&addr2,&pk1);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack(&local_68,&tx1,0,(ByteData *)&addr2);
  cfd::core::ScriptWitness::~ScriptWitness(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&addr2,&tx1.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperEQ<char[577],std::__cxx11::string>
            ((internal *)&sig2,
             "\"020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000\""
             ,"tx1.GetHex()",
             (char (*) [577])
             "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&addr2,"cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338",
             (allocator *)&sig2);
  cfd::core::BlockHash::BlockHash(&genesis_block_hash,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx2,2,0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)&addr2,&tx1.super_AbstractTransaction);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&tx2,(Txid *)&addr2,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::string
            ((string *)&sig2,"ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0",(allocator *)&schnorr_sig
            );
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&addr2,(string *)&sig2,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &val2);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &val2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount(&amt2,0x9502f130);
  cfd::core::ConfidentialValue::ConfidentialValue(&val2,&amt2);
  cfd::core::Address::GetLockingScript((Script *)&sig2,&addr2);
  cfd::core::ConfidentialTransaction::AddTxOut(&tx2,&amt2,&asset,(Script *)&sig2);
  cfd::core::Script::~Script((Script *)&sig2);
  cfd::core::Amount::Amount(&fee2,1000);
  cfd::core::ConfidentialTransaction::AddTxOutFee(&tx1,&fee2,&asset);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            (&utxo_list,1,(allocator_type *)&sig2);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&sig2,&locking_script,&asset,&val1);
  cfd::core::ConfidentialTxOut::operator=
            (utxo_list.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start,(ConfidentialTxOut *)&sig2);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&sig2);
  cfd::core::TapScriptData::TapScriptData(&script_data);
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&sig2,&tree);
  cfd::core::ByteData256::operator=(&script_data.tap_leaf_hash,(ByteData256 *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::SigHashType::SigHashType(&local_4a0,&sighash_type);
  cfd::core::ByteData::ByteData(&sig2.data_);
  utxo_list_00 = &utxo_list;
  cfd::core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
            (&sighash2,&tx2,0,&local_4a0,&genesis_block_hash,utxo_list_00,&script_data,&sig2.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&sig2,&sighash2);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&schnorr_sig,
             "\"10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8\"",
             "sighash2.GetHex()",
             (char (*) [65])"10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  if ((char)schnorr_sig.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)schnorr_sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&schnorr_sig.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::SchnorrUtil::Sign(&sig2,&sighash2,&key);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&schnorr_sig,&sig2,false);
  testing::internal::CmpHelperEQ<char[129],std::__cxx11::string>
            ((internal *)&gtest_ar_7,
             "\"ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&schnorr_sig);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&schnorr_sig);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&schnorr_sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&schnorr_sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig,&sig2);
  cfd::core::SchnorrSignature::SetSigHashType(&schnorr_sig,&sighash_type);
  cfd::core::SchnorrSignature::GetData((ByteData *)&gtest_ar_7,&schnorr_sig,true);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_88,&tx2,0,(ByteData *)&gtest_ar_7);
  cfd::core::ScriptWitness::~ScriptWitness(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7);
  cfd::core::Script::GetData((ByteData *)&gtest_ar_7,&redeem_script);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_a8,&tx2,0,(ByteData *)&gtest_ar_7);
  cfd::core::ScriptWitness::~ScriptWitness(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack(&local_c8,&tx2,0,&taproot_control);
  cfd::core::ScriptWitness::~ScriptWitness(&local_c8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar_7,&tx2.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<char[647],std::__cxx11::string>
            ((internal *)&gtest_ar_8,
             "\"0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000\""
             ,"tx2.GetHex()",
             (char (*) [647])
             "0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_7);
  std::__cxx11::string::~string((string *)&gtest_ar_7);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_988,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  gtest_ar_8.success_ = cfd::core::SchnorrPubkey::Verify(&schnorr_pubkey,&schnorr_sig,&sighash2);
  gtest_ar_8.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar_8.success_) {
    testing::Message::Message((Message *)&local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar_8,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)utxo_list_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xd8,(char *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_));
    testing::internal::AssertHelper::operator=(&local_950,(Message *)&local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_950);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_988);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::~vector
            (&utxo_list);
  cfd::core::ConfidentialValue::~ConfidentialValue(&val2);
  cfd::core::Address::~Address(&addr2);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx2);
  cfd::core::BlockHash::~BlockHash(&genesis_block_hash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::core::Script::~Script(&pkh_script1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  cfd::core::ConfidentialValue::~ConfidentialValue(&val1);
  cfd::core::ConfidentialValue::~ConfidentialValue(&val0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx1);
  cfd::core::Address::~Address(&addr01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_control);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk0);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&redeem_script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c", addr01.GetLockingScript().GetHex());

  ConfidentialTransaction tx1(2, 0);
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  tx1.AddTxIn(
      Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"),
      0, 0xffffffff);  // ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0
  Amount amt0(int64_t{2500000000});
  ConfidentialValue val0(amt0);
  Amount amt1(int64_t{2499999000});
  ConfidentialValue val1(amt1);
  tx1.AddTxOut(amt1, asset, locking_script);
  Amount fee1(int64_t{1000});
  tx1.AddTxOutFee(fee1, asset);
  EXPECT_EQ("020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetElementsSignatureHash(0, pkh_script1.GetData(),
        sighash_type, val0, WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000", tx1.GetHex());
  
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  ConfidentialTransaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0", GetElementsAddressFormatList());
  Amount amt2(int64_t{2499998000});
  ConfidentialValue val2(amt2);
  tx2.AddTxOut(amt2, asset, addr2.GetLockingScript());
  Amount fee2(int64_t{1000});
  tx1.AddTxOutFee(fee2, asset);
  std::vector<ConfidentialTxOut> utxo_list(1);
  utxo_list[0] = ConfidentialTxOut(locking_script, asset, val1);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}